

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O2

void BZ2_hbAssignCodes(Int32 *code,UChar *length,Int32 minLen,Int32 maxLen,Int32 alphaSize)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)alphaSize;
  iVar1 = 0;
  if (alphaSize < 1) {
    uVar2 = 0;
    iVar1 = 0;
  }
  for (; minLen <= maxLen; minLen = minLen + 1) {
    for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      if (minLen == (uint)length[uVar3]) {
        code[uVar3] = iVar1;
        iVar1 = iVar1 + 1;
      }
    }
    iVar1 = iVar1 * 2;
  }
  return;
}

Assistant:

void BZ2_hbAssignCodes ( Int32 *code,
                         UChar *length,
                         Int32 minLen,
                         Int32 maxLen,
                         Int32 alphaSize )
{
   Int32 n, vec, i;

   vec = 0;
   for (n = minLen; n <= maxLen; n++) {
      for (i = 0; i < alphaSize; i++)
         if (length[i] == n) { code[i] = vec; vec++; };
      vec <<= 1;
   }
}